

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O3

void __thiscall
flow::lang::CallExpr::CallExpr
          (CallExpr *this,SourceLocation *loc,CallableSym *callee,ParamList *args)

{
  pointer pcVar1;
  undefined8 uVar2;
  pointer pbVar3;
  pointer puVar4;
  uint uVar5;
  
  (this->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_0019b6c0;
  (this->super_Expr).super_ASTNode.location_.filename._M_dataplus._M_p =
       (pointer)&(this->super_Expr).super_ASTNode.location_.filename.field_2;
  pcVar1 = (loc->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Expr).super_ASTNode.location_,pcVar1,
             pcVar1 + (loc->filename)._M_string_length);
  uVar5 = (loc->end).offset;
  (this->super_Expr).super_ASTNode.location_.end.column = (loc->end).column;
  (this->super_Expr).super_ASTNode.location_.end.offset = uVar5;
  uVar5 = (loc->begin).column;
  uVar2 = *(undefined8 *)&(loc->begin).offset;
  (this->super_Expr).super_ASTNode.location_.begin.line = (loc->begin).line;
  (this->super_Expr).super_ASTNode.location_.begin.column = uVar5;
  *(undefined8 *)&(this->super_Expr).super_ASTNode.location_.begin.offset = uVar2;
  (this->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__CallExpr_0019baa0;
  this->callee_ = callee;
  (this->args_).isNamed_ = args->isNamed_;
  pbVar3 = (args->names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->args_).names_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args->names_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->args_).names_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  (this->args_).names_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args->names_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar4 = (args->values_).
           super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->args_).values_.
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args->values_).
       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->args_).values_.
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar4;
  (this->args_).values_.
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args->values_).
       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args->values_).
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args->values_).
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args->values_).
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

CallExpr(const SourceLocation& loc, CallableSym* callee, ParamList&& args)
      : Expr(loc), callee_(callee), args_(std::move(args)) {}